

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LBBox3fa * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx2::CurveGeometryInterface,_embree::BezierCurveT>
::vlinearBounds(LBBox3fa *__return_storage_ptr__,
               CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx2::CurveGeometryInterface,_embree::BezierCurveT>
               *this,size_t primID,BBox1f *time_range)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t itime;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  undefined1 auVar23 [16];
  float fVar27;
  undefined1 auVar25 [16];
  float fVar28;
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  anon_class_16_2_07cfa4d6 local_108;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  size_t local_a0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_108.primID = &local_a0;
  fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  fVar8 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar7 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper - fVar8;
  fVar15 = (time_range->lower - fVar8) / fVar7;
  fVar7 = (time_range->upper - fVar8) / fVar7;
  fVar8 = fVar1 * fVar15;
  fVar10 = fVar1 * fVar7;
  auVar33 = vroundss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),9);
  auVar26 = vroundss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10),10);
  auVar23 = vmaxss_avx(auVar33,ZEXT816(0));
  auVar30 = vminss_avx(auVar26,ZEXT416((uint)fVar1));
  fVar9 = auVar23._0_4_;
  fVar19 = auVar30._0_4_;
  iVar5 = (int)auVar33._0_4_;
  iVar6 = -1;
  if (-1 < iVar5) {
    iVar6 = iVar5;
  }
  iVar4 = (int)fVar1 + 1;
  if ((int)auVar26._0_4_ < (int)fVar1 + 1) {
    iVar4 = (int)auVar26._0_4_;
  }
  local_108.this = this;
  local_a0 = primID;
  linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_108,(long)(int)fVar9);
  linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_108,(long)(int)fVar19);
  if (iVar4 - iVar6 == 1) {
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar8 - fVar9)),ZEXT816(0) << 0x40);
    fVar8 = auVar23._0_4_;
    fVar1 = 1.0 - fVar8;
    auVar31._0_4_ = fVar8 * bupper1.lower.field_0._0_4_;
    auVar31._4_4_ = fVar8 * bupper1.lower.field_0._4_4_;
    auVar31._8_4_ = fVar8 * bupper1.lower.field_0._8_4_;
    auVar31._12_4_ = fVar8 * bupper1.lower.field_0._12_4_;
    auVar20._4_4_ = fVar1;
    auVar20._0_4_ = fVar1;
    auVar20._8_4_ = fVar1;
    auVar20._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar31,auVar20,blower0.lower.field_0);
    auVar11._0_4_ = fVar8 * bupper1.upper.field_0._0_4_;
    auVar11._4_4_ = fVar8 * bupper1.upper.field_0._4_4_;
    auVar11._8_4_ = fVar8 * bupper1.upper.field_0._8_4_;
    auVar11._12_4_ = fVar8 * bupper1.upper.field_0._12_4_;
    aVar3.m128 = (__m128)vfmadd231ps_fma(auVar11,blower0.upper.field_0,auVar20);
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar3;
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar19 - fVar10)),ZEXT816(0) << 0x40);
    fVar8 = auVar23._0_4_;
    fVar1 = 1.0 - fVar8;
    auVar21._0_4_ = fVar8 * blower0.lower.field_0._0_4_;
    auVar21._4_4_ = fVar8 * blower0.lower.field_0._4_4_;
    auVar21._8_4_ = fVar8 * blower0.lower.field_0._8_4_;
    auVar21._12_4_ = fVar8 * blower0.lower.field_0._12_4_;
    auVar16._4_4_ = fVar1;
    auVar16._0_4_ = fVar1;
    auVar16._8_4_ = fVar1;
    auVar16._12_4_ = fVar1;
    aVar2.m128 = (__m128)vfmadd231ps_fma(auVar21,auVar16,bupper1.lower.field_0);
    auVar12._0_4_ = fVar8 * blower0.upper.field_0._0_4_;
    auVar12._4_4_ = fVar8 * blower0.upper.field_0._4_4_;
    auVar12._8_4_ = fVar8 * blower0.upper.field_0._8_4_;
    auVar12._12_4_ = fVar8 * blower0.upper.field_0._12_4_;
    aVar3.m128 = (__m128)vfmadd231ps_fma(auVar12,auVar16,bupper1.upper.field_0);
    (__return_storage_ptr__->bounds1).lower.field_0 = aVar2;
    (__return_storage_ptr__->bounds1).upper.field_0 = aVar3;
  }
  else {
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_108,(long)((int)fVar9 + 1));
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper0,&local_108,(long)((int)fVar19 + -1))
    ;
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar8 - fVar9)),ZEXT816(0) << 0x40);
    fVar9 = auVar23._0_4_;
    auVar29._0_4_ = fVar9 * blower1.lower.field_0.m128[0];
    auVar29._4_4_ = fVar9 * blower1.lower.field_0.m128[1];
    auVar29._8_4_ = fVar9 * blower1.lower.field_0.m128[2];
    auVar29._12_4_ = fVar9 * blower1.lower.field_0.m128[3];
    fVar8 = 1.0 - fVar9;
    auVar13._4_4_ = fVar8;
    auVar13._0_4_ = fVar8;
    auVar13._8_4_ = fVar8;
    auVar13._12_4_ = fVar8;
    auVar30 = vfmadd231ps_fma(auVar29,auVar13,(undefined1  [16])blower0.lower.field_0);
    auVar32._0_4_ = fVar9 * blower1.upper.field_0.m128[0];
    auVar32._4_4_ = fVar9 * blower1.upper.field_0.m128[1];
    auVar32._8_4_ = fVar9 * blower1.upper.field_0.m128[2];
    auVar32._12_4_ = fVar9 * blower1.upper.field_0.m128[3];
    auVar33 = vfmadd231ps_fma(auVar32,auVar13,(undefined1  [16])blower0.upper.field_0);
    auVar23 = vmaxss_avx(ZEXT416((uint)(fVar19 - fVar10)),ZEXT816(0) << 0x40);
    fVar10 = auVar23._0_4_;
    fVar8 = 1.0 - fVar10;
    auVar22._0_4_ = fVar10 * bupper0.lower.field_0.m128[0];
    auVar22._4_4_ = fVar10 * bupper0.lower.field_0.m128[1];
    auVar22._8_4_ = fVar10 * bupper0.lower.field_0.m128[2];
    auVar22._12_4_ = fVar10 * bupper0.lower.field_0.m128[3];
    auVar17._4_4_ = fVar8;
    auVar17._0_4_ = fVar8;
    auVar17._8_4_ = fVar8;
    auVar17._12_4_ = fVar8;
    auVar23 = vfmadd231ps_fma(auVar22,auVar17,(undefined1  [16])bupper1.lower.field_0);
    auVar25._0_4_ = fVar10 * bupper0.upper.field_0.m128[0];
    auVar25._4_4_ = fVar10 * bupper0.upper.field_0.m128[1];
    auVar25._8_4_ = fVar10 * bupper0.upper.field_0.m128[2];
    auVar25._12_4_ = fVar10 * bupper0.upper.field_0.m128[3];
    auVar26 = vfmadd231ps_fma(auVar25,auVar17,(undefined1  [16])bupper1.upper.field_0);
    iVar6 = -1;
    if (-1 < iVar5) {
      iVar6 = iVar5;
    }
    itime = (size_t)iVar6;
    while (itime = itime + 1, (long)itime < (long)iVar4) {
      fVar10 = ((float)(int)itime / fVar1 - fVar15) / (fVar7 - fVar15);
      fVar8 = 1.0 - fVar10;
      auVar34._0_4_ = auVar23._0_4_ * fVar10;
      fVar19 = auVar23._4_4_;
      auVar34._4_4_ = fVar19 * fVar10;
      fVar9 = auVar23._8_4_;
      auVar34._8_4_ = fVar9 * fVar10;
      fVar24 = auVar23._12_4_;
      auVar34._12_4_ = fVar24 * fVar10;
      auVar18._4_4_ = fVar8;
      auVar18._0_4_ = fVar8;
      auVar18._8_4_ = fVar8;
      auVar18._12_4_ = fVar8;
      auVar13 = vfmadd231ps_fma(auVar34,auVar18,auVar30);
      auVar14._0_4_ = auVar26._0_4_ * fVar10;
      fVar8 = auVar26._4_4_;
      auVar14._4_4_ = fVar8 * fVar10;
      fVar27 = auVar26._8_4_;
      auVar14._8_4_ = fVar27 * fVar10;
      fVar28 = auVar26._12_4_;
      auVar14._12_4_ = fVar28 * fVar10;
      auVar17 = vfmadd231ps_fma(auVar14,auVar33,auVar18);
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_108,itime);
      local_148 = auVar33._0_4_;
      fStack_144 = auVar33._4_4_;
      fStack_140 = auVar33._8_4_;
      fStack_13c = auVar33._12_4_;
      local_138 = auVar30._0_4_;
      fStack_134 = auVar30._4_4_;
      fStack_130 = auVar30._8_4_;
      fStack_12c = auVar30._12_4_;
      auVar30 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar13);
      auVar13 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar17);
      auVar33 = vminps_avx(auVar30,ZEXT816(0) << 0x40);
      auVar13 = vmaxps_avx(auVar13,ZEXT816(0) << 0x40);
      auVar30._0_4_ = local_138 + auVar33._0_4_;
      auVar30._4_4_ = fStack_134 + auVar33._4_4_;
      auVar30._8_4_ = fStack_130 + auVar33._8_4_;
      auVar30._12_4_ = fStack_12c + auVar33._12_4_;
      auVar23._0_4_ = auVar23._0_4_ + auVar33._0_4_;
      auVar23._4_4_ = fVar19 + auVar33._4_4_;
      auVar23._8_4_ = fVar9 + auVar33._8_4_;
      auVar23._12_4_ = fVar24 + auVar33._12_4_;
      auVar33._0_4_ = local_148 + auVar13._0_4_;
      auVar33._4_4_ = fStack_144 + auVar13._4_4_;
      auVar33._8_4_ = fStack_140 + auVar13._8_4_;
      auVar33._12_4_ = fStack_13c + auVar13._12_4_;
      auVar26._0_4_ = auVar26._0_4_ + auVar13._0_4_;
      auVar26._4_4_ = fVar8 + auVar13._4_4_;
      auVar26._8_4_ = fVar27 + auVar13._8_4_;
      auVar26._12_4_ = fVar28 + auVar13._12_4_;
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar30;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar33;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).lower.field_0.m128 = auVar23;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds1).upper.field_0.m128 = auVar26;
  }
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(size_t primID, const BBox1f& time_range) const {
        return linearBounds(primID,time_range);
      }